

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O1

token * thread_specifier(dmr_C *C,token *next,decl_state *ctx)

{
  if ((ctx->storage_class < 6) && ((0x31U >> (ctx->storage_class & 0x1f) & 1) != 0)) {
    ctx->is_tls = '\x01';
  }
  else {
    dmrC_sparse_error(C,next->pos,"__thread can only be used alone, or with extern or static");
  }
  return next;
}

Assistant:

static struct token *thread_specifier(struct dmr_C *C, struct token *next, struct decl_state *ctx)
{
	/* This GCC extension can be used alone, or with extern or static */
	if (!ctx->storage_class || ctx->storage_class == SStatic
			|| ctx->storage_class == SExtern) {
		ctx->is_tls = 1;
	} else {
		dmrC_sparse_error(C, next->pos, "__thread can only be used alone, or "
				"with extern or static");
	}

	return next;
}